

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::EvaluateSectionFrame
          (ChElementBeamANCF_3333 *this,double xi,ChVector<double> *point,ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  ChVector<double> CrossSectionY;
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_compact;
  VectorN Sxi_eta_compact;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  ChVector<double> local_258;
  Matrix3xN *local_240;
  Matrix3xN *local_238;
  double *local_230;
  undefined8 local_220;
  double local_208;
  ChVector<double> local_1f8;
  VectorN local_1e0;
  undefined8 local_198;
  double local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  double local_160;
  undefined8 local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  Matrix3xN local_108;
  
  Calc_Sxi_compact(this,&local_1e0,xi,0.0,0.0);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = xi;
  local_150 = xi + -0.5;
  dVar9 = this->m_thicknessY;
  local_178 = dVar9 * 0.25;
  auVar7 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar34,ZEXT816(0x4000000000000000));
  local_148 = auVar7._0_8_ * local_178 * 0.0;
  local_128 = this->m_thicknessZ * 0.25 * 0.0;
  local_140 = auVar7._0_8_ * local_128;
  local_138 = xi + 0.5;
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar34,ZEXT816(0x3ff0000000000000));
  local_130 = auVar7._0_8_ * local_178 * 0.0;
  local_128 = auVar7._0_8_ * local_128;
  local_120 = xi * -2.0;
  local_118 = xi * dVar9 * -0.0;
  local_110 = xi * this->m_thicknessZ * -0.0;
  local_198 = 0;
  auVar7 = vfmsub213sd_fma(auVar34,auVar34,auVar34);
  local_190 = auVar7._0_8_ * local_178;
  local_188 = 0;
  uStack_180 = 0;
  auVar7 = vfmadd213sd_fma(auVar34,auVar34,auVar34);
  local_178 = auVar7._0_8_ * local_178;
  local_170 = 0;
  uStack_168 = 0;
  auVar7 = vfnmadd213sd_fma(auVar34,auVar34,ZEXT816(0x3ff0000000000000));
  local_160 = auVar7._0_8_ * dVar9 * 0.5;
  local_158 = 0;
  CalcCoordMatrix(this,&local_108);
  local_238 = (Matrix3xN *)&local_1e0;
  local_240 = &local_108;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
                    *)&local_240);
  local_208 = this->m_lenX;
  local_220 = 0x4000000000000000;
  local_238 = &local_108;
  local_230 = &local_150;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_1f8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_240,(type *)0x0);
  local_208 = this->m_thicknessY;
  local_238 = &local_108;
  local_220 = 0x4000000000000000;
  local_230 = (double *)&local_198;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_258,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_240,(type *)0x0);
  auVar39 = ZEXT816(0x3ff0000000000000);
  auVar7 = ZEXT816(0) << 0x40;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_1f8.m_data[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_1f8.m_data[2];
  if ((((local_1f8.m_data[0] != 0.0) || (NAN(local_1f8.m_data[0]))) || (local_1f8.m_data[1] != 0.0))
     || (NAN(local_1f8.m_data[1]))) {
LAB_00740391:
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_1f8.m_data[1] * local_1f8.m_data[1];
    auVar7 = vfmadd231sd_fma(auVar13,auVar8,auVar8);
    auVar7 = vfmadd231sd_fma(auVar7,auVar28,auVar28);
    if (auVar7._0_8_ < 0.0) {
      dVar9 = sqrt(auVar7._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar9 = auVar7._0_8_;
    }
    bVar4 = 2.2250738585072014e-308 <= dVar9;
    dVar9 = 1.0 / dVar9;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)bVar4 * (long)(local_1f8.m_data[1] * dVar9);
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         (ulong)bVar4 * (long)(local_1f8.m_data[0] * dVar9) + (ulong)!bVar4 * 0x3ff0000000000000;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)bVar4 * (long)(local_1f8.m_data[2] * dVar9);
  }
  else {
    auVar6 = ZEXT816(0) << 0x40;
    if ((local_1f8.m_data[2] != 0.0) || (NAN(local_1f8.m_data[2]))) goto LAB_00740391;
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_258.m_data[2];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_258.m_data[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_258.m_data[1];
  dVar37 = auVar7._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_258.m_data[1] * dVar37;
  auVar8 = vfmsub231sd_fma(auVar26,auVar6,auVar14);
  dVar9 = auVar8._0_8_;
  dVar38 = auVar39._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar38 * local_258.m_data[2];
  auVar28 = vfmsub231sd_fma(auVar42,auVar7,auVar22);
  dVar40 = auVar6._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar40 * local_258.m_data[0];
  auVar34 = vfmsub231sd_fma(auVar33,auVar39,auVar25);
  dVar11 = auVar34._0_8_;
  dVar41 = auVar28._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar41 * dVar41;
  auVar8 = vfmadd231sd_fma(auVar15,auVar8,auVar8);
  auVar8 = vfmadd231sd_fma(auVar8,auVar34,auVar34);
  if (auVar8._0_8_ < 0.0) {
    dVar10 = sqrt(auVar8._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar10 = auVar8._0_8_;
  }
  if (0.0001 <= dVar10) goto LAB_007405c7;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_258.m_data[0];
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar8 = vandpd_avx512vl(auVar23,auVar1);
  if (0.9 <= auVar8._0_8_) {
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_258.m_data[1];
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar29,auVar2);
    if (0.9 <= auVar8._0_8_) {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_258.m_data[2];
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar8 = vandpd_avx512vl(auVar30,auVar3);
      auVar28 = ZEXT816(0);
      if (0.9 <= auVar8._0_8_) goto LAB_0074054a;
      auVar8 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar28 = ZEXT816(0x3ff0000000000000);
LAB_0074054a:
      auVar8 = ZEXT816(0);
    }
    auVar34 = ZEXT816(0) << 0x40;
  }
  else {
    auVar34 = ZEXT816(0x3ff0000000000000);
    auVar8 = ZEXT816(0);
    auVar28 = ZEXT816(0) << 0x40;
  }
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar28._0_8_ * -dVar37;
  auVar13 = vfmadd231sd_fma(auVar27,auVar6,auVar8);
  dVar9 = auVar13._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar8._0_8_ * -dVar38;
  auVar8 = vfmadd231sd_fma(auVar43,auVar7,auVar34);
  dVar41 = auVar8._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar34._0_8_ * -dVar40;
  auVar8 = vfmadd231sd_fma(auVar35,auVar39,auVar28);
  dVar11 = auVar8._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar41 * dVar41;
  auVar28 = vfmadd231sd_fma(auVar16,auVar13,auVar13);
  auVar8 = vfmadd231sd_fma(auVar28,auVar8,auVar8);
  if (auVar8._0_8_ < 0.0) {
    dVar10 = sqrt(auVar8._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar10 = auVar8._0_8_;
  }
LAB_007405c7:
  dVar10 = 1.0 / dVar10;
  dVar9 = dVar9 * dVar10;
  dVar41 = dVar41 * dVar10;
  dVar11 = dVar11 * dVar10;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar40 * dVar11;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar41;
  auVar7 = vfmsub231sd_fma(auVar36,auVar44,auVar7);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar11;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar37 * dVar9;
  auVar8 = vfmsub231sd_fma(auVar24,auVar17,auVar39);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar9;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar38 * dVar41;
  auVar28 = vfmsub231sd_fma(auVar46,auVar31,auVar6);
  dVar12 = auVar8._0_8_;
  dVar10 = dVar11 + dVar38 + dVar12;
  dVar32 = auVar7._0_8_;
  dVar45 = auVar28._0_8_;
  if (0.0 <= dVar10) {
    dVar10 = dVar10 + 1.0;
    if (dVar10 < 0.0) {
      dVar11 = sqrt(dVar10);
    }
    else {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar10;
      auVar7 = vsqrtsd_avx(auVar18,auVar18);
      dVar11 = auVar7._0_8_;
    }
    dVar12 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar38 = (dVar45 - dVar41) * dVar11;
    dVar10 = (dVar9 - dVar37) * dVar11;
    dVar11 = (dVar40 - dVar32) * dVar11;
  }
  else {
    cVar5 = dVar38 < dVar12;
    dVar10 = dVar38;
    if ((bool)cVar5) {
      dVar10 = dVar12;
    }
    if (dVar10 < dVar11) {
      cVar5 = '\x02';
    }
    if (cVar5 == '\x02') {
      dVar11 = ((dVar11 - dVar38) - dVar12) + 1.0;
      if (dVar11 < 0.0) {
        dVar12 = sqrt(dVar11);
      }
      else {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar11;
        auVar7 = vsqrtsd_avx(auVar20,auVar20);
        dVar12 = auVar7._0_8_;
      }
      dVar11 = dVar12 * 0.5;
      dVar12 = 0.5 / dVar12;
      dVar38 = (dVar37 + dVar9) * dVar12;
      dVar10 = (dVar41 + dVar45) * dVar12;
      dVar9 = dVar40 - dVar32;
    }
    else if (cVar5 == '\x01') {
      dVar11 = ((dVar12 - dVar11) - dVar38) + 1.0;
      if (dVar11 < 0.0) {
        dVar12 = sqrt(dVar11);
      }
      else {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar11;
        auVar7 = vsqrtsd_avx(auVar19,auVar19);
        dVar12 = auVar7._0_8_;
      }
      dVar10 = dVar12 * 0.5;
      dVar12 = 0.5 / dVar12;
      dVar11 = (dVar41 + dVar45) * dVar12;
      dVar38 = (dVar40 + dVar32) * dVar12;
      dVar9 = dVar9 - dVar37;
    }
    else {
      dVar11 = ((dVar38 - dVar12) - dVar11) + 1.0;
      if (dVar11 < 0.0) {
        dVar12 = sqrt(dVar11);
      }
      else {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar11;
        auVar7 = vsqrtsd_avx(auVar21,auVar21);
        dVar12 = auVar7._0_8_;
      }
      dVar38 = dVar12 * 0.5;
      dVar12 = 0.5 / dVar12;
      dVar10 = (dVar40 + dVar32) * dVar12;
      dVar11 = (dVar37 + dVar9) * dVar12;
      dVar9 = dVar45 - dVar41;
    }
    dVar12 = dVar9 * dVar12;
  }
  rot->m_data[0] = dVar12;
  rot->m_data[1] = dVar38;
  rot->m_data[2] = dVar10;
  rot->m_data[3] = dVar11;
  return;
}

Assistant:

void ChElementBeamANCF_3333::EvaluateSectionFrame(const double xi, ChVector<>& point, ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> CrossSectionY = e_bar * Sxi_eta_compact * 2 / m_thicknessY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the beam axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the cross section Y direction
    ChMatrix33<> msect;
    msect.Set_A_Xdir(BeamAxisTangent, CrossSectionY);

    rot = msect.Get_A_quaternion();
}